

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O2

void __thiscall
r_exec::CmdGuardBuilder::_build
          (CmdGuardBuilder *this,Code *mdl,uint16_t fwd_opcode,uint16_t bwd_opcode,uint16_t q0,
          uint16_t t0,uint16_t t1,uint16_t *write_index)

{
  ushort uVar1;
  uint16_t *puVar2;
  short sVar3;
  CmdGuardBuilder *pCVar4;
  undefined2 uVar5;
  uint16_t uVar6;
  int iVar7;
  undefined4 extraout_var;
  long *plVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  uint16_t r;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  uchar uVar9;
  ushort uVar10;
  TimingGuardBuilder *this_00;
  TimingGuardBuilder *this_01;
  undefined6 in_register_00000082;
  undefined6 in_register_0000008a;
  uint uVar11;
  TimingGuardBuilder TStack_68;
  undefined4 local_50;
  undefined4 local_4c;
  CmdGuardBuilder *local_48;
  uint local_40;
  uint local_3c;
  undefined4 local_38;
  uint local_34;
  
  this_00 = &TStack_68;
  this_01 = &TStack_68;
  TStack_68.period._0_4_ = (uint)CONCAT62(in_register_0000008a,t0);
  local_34 = (uint)CONCAT62(in_register_00000082,q0);
  local_38 = (undefined4)CONCAT62(in_register_0000000a,bwd_opcode);
  TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._0_4_ =
       (uint)CONCAT62(in_register_00000012,fwd_opcode);
  iVar7 = (*(mdl->super__Object)._vptr__Object[9])(mdl,1);
  plVar8 = (long *)CONCAT44(extraout_var,iVar7);
  (**(code **)(*plVar8 + 0x20))(plVar8,2);
  uVar5 = r_code::Atom::asIndex();
  local_48 = (CmdGuardBuilder *)CONCAT62(local_48._2_6_,uVar5);
  (**(code **)(*plVar8 + 0x20))(plVar8,3);
  uVar5 = r_code::Atom::asIndex();
  TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_4_ =
       CONCAT22(TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i.
                _6_2_,uVar5);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x48))(plVar8,0);
  (**(code **)(*plVar8 + 0x20))(plVar8,3);
  local_4c = r_code::Atom::asIndex();
  iVar7 = (*(mdl->super__Object)._vptr__Object[9])(mdl,0);
  plVar8 = (long *)CONCAT44(extraout_var_00,iVar7);
  (**(code **)(*plVar8 + 0x20))(plVar8,2);
  TStack_68.period._6_2_ = r_code::Atom::asIndex();
  (**(code **)(*plVar8 + 0x20))(plVar8,3);
  uVar6 = r_code::Atom::asIndex();
  plVar8 = (long *)(**(code **)(*plVar8 + 0x48))(plVar8,0);
  (**(code **)(*plVar8 + 0x20))(plVar8,this->cmd_arg_index);
  local_50 = r_code::Atom::asIndex();
  *write_index = *write_index + 1;
  uVar10 = (ushort)&TStack_68;
  r_code::Atom::IPointer(uVar10);
  iVar7 = (*(mdl->super__Object)._vptr__Object[4])(mdl,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar7),(Atom *)&TStack_68);
  TStack_68.period._4_2_ = uVar6;
  r_code::Atom::~Atom((Atom *)&TStack_68);
  uVar9 = (uchar)&TStack_68;
  r_code::Atom::Set(uVar9);
  iVar7 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar7),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_ = *write_index + 3;
  puVar2 = (uint16_t *)((long)&TStack_68.super_GuardBuilder.super__Object._vptr__Object + 6);
  uVar6 = (uint16_t)TStack_68.period;
  local_3c = (uint)TStack_68.period & 0xffff;
  TStack_68.period._0_4_ = (uint)(ushort)local_48;
  TimingGuardBuilder::write_guard
            (this_00,mdl,(ushort)local_48,uVar6,Opcodes::Add,(this->super_TimingGuardBuilder).period
             ,write_index,puVar2);
  uVar6 = TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_2_;
  TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_4_ =
       TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_4_ &
       0xffff;
  local_40 = (uint)t1;
  local_48 = this;
  TimingGuardBuilder::write_guard
            (this_00,mdl,uVar6,t1,Opcodes::Add,(this->super_TimingGuardBuilder).period,write_index,
             puVar2);
  sVar3 = TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_;
  uVar1 = TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_ + 1;
  TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_ = uVar1;
  r_code::Atom::AssignmentPointer(uVar9,(ushort)(byte)local_4c);
  uVar6 = *write_index;
  *write_index = uVar6 + 1;
  iVar7 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar6 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar7),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::Operator
            (uVar10,(uchar)(uint)TStack_68.super_GuardBuilder.super__Object.refCount.
                                 super___atomic_base<long>._M_i);
  iVar7 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar7),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  uVar11 = local_34 & 0xffff;
  r_code::Atom::VLPointer(uVar10,(ushort)local_34);
  iVar7 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(sVar3 + 2));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar7),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::VLPointer(uVar10,(ushort)local_50);
  TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_ = sVar3 + 3;
  iVar7 = (*(mdl->super__Object)._vptr__Object[4])
                    (mdl,(ulong)TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar7),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  *write_index = sVar3 + 5;
  r_code::Atom::IPointer(uVar10);
  iVar7 = (*(mdl->super__Object)._vptr__Object[4])(mdl,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_07,iVar7),(Atom *)&TStack_68);
  TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._0_4_ = uVar11;
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::Set(uVar9);
  iVar7 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_08,iVar7),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  pCVar4 = local_48;
  TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_ = *write_index + 5;
  puVar2 = (uint16_t *)((long)&TStack_68.super_GuardBuilder.super__Object._vptr__Object + 6);
  uVar6 = (uint16_t)(uint)TStack_68.period;
  TimingGuardBuilder::write_guard
            (this_01,mdl,(uint16_t)local_3c,uVar6,Opcodes::Sub,
             (local_48->super_TimingGuardBuilder).period,write_index,puVar2);
  r = (uint16_t)
      TStack_68.super_GuardBuilder.super__Object.refCount.super___atomic_base<long>._M_i._4_4_;
  TimingGuardBuilder::write_guard
            (this_01,mdl,(uint16_t)local_40,r,Opcodes::Sub,(pCVar4->super_TimingGuardBuilder).period
             ,write_index,puVar2);
  TimingGuardBuilder::write_guard
            (this_01,mdl,TStack_68.period._6_2_,uVar6,Opcodes::Sub,
             (pCVar4->super_TimingGuardBuilder).period,write_index,puVar2);
  TimingGuardBuilder::write_guard
            (this_01,mdl,TStack_68.period._4_2_,r,Opcodes::Sub,
             (pCVar4->super_TimingGuardBuilder).period,write_index,puVar2);
  sVar3 = TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_;
  uVar1 = TStack_68.super_GuardBuilder.super__Object._vptr__Object._6_2_ + 1;
  r_code::Atom::AssignmentPointer(uVar9,(ushort)(byte)local_50);
  uVar6 = *write_index;
  *write_index = uVar6 + 1;
  iVar7 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar6 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_09,iVar7),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::Operator(uVar10,(uchar)local_38);
  iVar7 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_10,iVar7),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::VLPointer(uVar10,(ushort)local_4c);
  iVar7 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(sVar3 + 2));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_11,iVar7),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  r_code::Atom::VLPointer
            (uVar10,(ushort)(uint)TStack_68.super_GuardBuilder.super__Object.refCount.
                                  super___atomic_base<long>._M_i);
  iVar7 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(sVar3 + 3));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_12,iVar7),(Atom *)&TStack_68);
  r_code::Atom::~Atom((Atom *)&TStack_68);
  *write_index = sVar3 + 4;
  return;
}

Assistant:

void CmdGuardBuilder::_build(Code *mdl, uint16_t fwd_opcode, uint16_t bwd_opcode, uint16_t q0, uint16_t t0, uint16_t t1, uint16_t &write_index) const
{
    Code *rhs = mdl->get_reference(1);
    uint16_t t2 = rhs->code(FACT_AFTER).asIndex();
    uint16_t t3 = rhs->code(FACT_BEFORE).asIndex();
    uint16_t q1 = rhs->get_reference(0)->code(MK_VAL_VALUE).asIndex();
    Code *lhs = mdl->get_reference(0);
    uint16_t cmd_t0 = lhs->code(FACT_AFTER).asIndex();
    uint16_t cmd_t1 = lhs->code(FACT_BEFORE).asIndex();
    uint16_t cmd_arg = lhs->get_reference(0)->code(cmd_arg_index).asIndex();
    mdl->code(MDL_FWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(3);
    uint16_t extent_index = write_index + 3;
    write_guard(mdl, t2, t0, Opcodes::Add, period, write_index, extent_index);
    write_guard(mdl, t3, t1, Opcodes::Add, period, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(q1, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(fwd_opcode, 2); // q1:(fwd_opcode q0 cmd_arg)
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    mdl->code(++extent_index) = Atom::VLPointer(cmd_arg);
    extent_index += 1;
    write_index = extent_index;
    mdl->code(MDL_BWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(5);
    extent_index = write_index + 5;
    write_guard(mdl, t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t1, t3, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, cmd_t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, cmd_t1, t3, Opcodes::Sub, period, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(cmd_arg, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(bwd_opcode, 2); // cmd_arg:(bwd_opcode q1 q0)
    mdl->code(++extent_index) = Atom::VLPointer(q1);
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    extent_index += 1;
    write_index = extent_index;
}